

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_loadDictionaryContent
                 (ZSTD_matchState_t *ms,ldmState_t *ls,ZSTD_cwksp *ws,ZSTD_CCtx_params *params,
                 void *src,size_t srcSize,ZSTD_dictTableLoadMethod_e dtlm,
                 ZSTD_tableFillPurpose_e tfp)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long in_RCX;
  ZSTD_window_t *in_RSI;
  ZSTD_window_t *in_RDI;
  void *in_R8;
  ulong in_R9;
  int in_stack_00000010;
  size_t tagTableSize;
  U32 maxDictSize_1;
  U32 shortCacheMaxDictSize;
  int CDictTaggedIndices;
  U32 maxDictSize;
  int loadLdmDict;
  BYTE *iend;
  BYTE *ip;
  ldmParams_t *iend_00;
  ZSTD_matchState_t *ms_00;
  ZSTD_matchState_t *ms_01;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff14;
  ZSTD_matchState_t *ms_02;
  int local_bc;
  byte local_b8;
  byte local_b4;
  uint in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  uint in_stack_ffffffffffffff58;
  uint3 in_stack_ffffffffffffff5c;
  uint uVar5;
  ZSTD_CCtx_params *in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  uint uVar6;
  ldmParams_t *params_00;
  ZSTD_matchState_t *ms_03;
  ZSTD_matchState_t *ip_00;
  undefined4 uVar7;
  uint uVar8;
  void *local_40;
  ulong local_38;
  void *local_30;
  
  lVar3 = (long)in_R8 + in_R9;
  uVar5 = (uint)in_stack_ffffffffffffff5c;
  if (*(int *)(in_RCX + 0x60) == 1) {
    uVar5 = CONCAT13(in_RSI != (ZSTD_window_t *)0x0,in_stack_ffffffffffffff5c);
  }
  uVar8 = uVar5 >> 0x18;
  iend_00 = *(ldmParams_t **)(in_RCX + 4);
  ms_00 = *(ZSTD_matchState_t **)(in_RCX + 0xc);
  ms_01 = *(ZSTD_matchState_t **)(in_RCX + 0x14);
  uVar4 = *(undefined4 *)(in_RCX + 0x1c);
  ms_02 = (ZSTD_matchState_t *)in_RDI[6].dictBase;
  params_00 = iend_00;
  ms_03 = ms_00;
  ip_00 = ms_01;
  uVar7 = uVar4;
  ZSTD_assertEqualCParams
            (*(ZSTD_compressionParameters *)(in_RCX + 4),
             *(ZSTD_compressionParameters *)&in_RDI[6].dictBase);
  uVar6 = 0xdffffffe;
  iVar2 = ZSTD_CDictIndicesAreTagged((ZSTD_compressionParameters *)(in_RCX + 4));
  if (((iVar2 != 0) && (in_stack_00000010 == 1)) &&
     (in_stack_ffffffffffffff6c = 0xfffffe, in_stack_ffffffffffffff58 = uVar6, 0xfffffd < uVar6)) {
    uVar6 = 0xfffffe;
    in_stack_ffffffffffffff58 = uVar6;
  }
  local_38 = in_R9;
  local_30 = in_R8;
  if (uVar6 < in_R9) {
    local_30 = (void *)(lVar3 - (ulong)uVar6);
    local_38 = (ulong)uVar6;
  }
  ZSTD_window_update(in_RDI,local_30,local_38,0);
  iVar1 = (int)lVar3;
  if (uVar8 != 0) {
    ZSTD_window_update(in_RSI,local_30,local_38,0);
    if (*(int *)(in_RCX + 0x30) == 0) {
      in_stack_ffffffffffffff54 = iVar1 - (int)in_RSI->base;
    }
    else {
      in_stack_ffffffffffffff54 = 0;
    }
    *(int *)&in_RSI[1].base = in_stack_ffffffffffffff54;
    ZSTD_ldm_fillHashTable
              ((ldmState_t *)CONCAT44(uVar8,uVar7),(BYTE *)ip_00,(BYTE *)ms_03,params_00);
  }
  local_40 = local_30;
  if (*(int *)(in_RCX + 0x1c) < 8) {
    if (*(uint *)(in_RCX + 8) < *(uint *)(in_RCX + 0xc)) {
      in_stack_ffffffffffffff50 = *(uint *)(in_RCX + 0xc);
    }
    else {
      in_stack_ffffffffffffff50 = *(uint *)(in_RCX + 8);
    }
    if (in_stack_ffffffffffffff50 < 0x1c) {
      if (*(uint *)(in_RCX + 8) < *(uint *)(in_RCX + 0xc)) {
        local_b4 = (byte)*(undefined4 *)(in_RCX + 0xc);
      }
      else {
        local_b4 = (byte)*(undefined4 *)(in_RCX + 8);
      }
      local_b8 = local_b4;
    }
    else {
      local_b8 = 0x1c;
    }
    in_stack_ffffffffffffff68 = 8 << (local_b8 & 0x1f);
    if (in_stack_ffffffffffffff68 < local_38) {
      local_40 = (void *)(lVar3 - (ulong)in_stack_ffffffffffffff68);
      local_38 = (ulong)in_stack_ffffffffffffff68;
    }
  }
  *(int *)((long)&in_RDI[1].nextSrc + 4) = (int)local_40 - (int)in_RDI->base;
  if (*(int *)(in_RCX + 0x30) == 0) {
    local_bc = iVar1 - (int)in_RDI->base;
  }
  else {
    local_bc = 0;
  }
  *(int *)&in_RDI[1].nextSrc = local_bc;
  *(undefined4 *)&in_RDI[3].dictBase = *(undefined4 *)(in_RCX + 0x94);
  if (8 < local_38) {
    ZSTD_overflowCorrectIfNeeded
              ((ZSTD_matchState_t *)CONCAT44(uVar6,iVar2),
               (ZSTD_cwksp *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               in_stack_ffffffffffffff60,(void *)CONCAT44(uVar5,in_stack_ffffffffffffff58),
               (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    switch(*(undefined4 *)(in_RCX + 0x1c)) {
    case 1:
      ZSTD_fillHashTable(ms_00,iend_00,ZSTD_dtlm_fast,0x8ad1c4);
      break;
    case 2:
      ZSTD_fillDoubleHashTable(ms_00,iend_00,ZSTD_dtlm_fast,0x8ad1ec);
      break;
    case 3:
    case 4:
    case 5:
      if (*(int *)((long)&in_RDI[3].dictBase + 4) == 0) {
        if (*(int *)(in_RCX + 0x90) == 1) {
          memset(in_RDI[1].dictBase,0,1L << ((byte)*(undefined4 *)(in_RCX + 0xc) & 0x3f));
          ZSTD_row_update((ZSTD_matchState_t *)CONCAT44(uVar6,iVar2),
                          (BYTE *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        }
        else {
          ZSTD_insertAndFindFirstIndex(ms_02,(BYTE *)CONCAT44(in_stack_ffffffffffffff14,uVar4));
        }
      }
      else {
        ZSTD_dedicatedDictSearch_lazy_loadDictionary(ms_03,(BYTE *)params_00);
      }
      break;
    case 6:
    case 7:
    case 8:
    case 9:
      ZSTD_updateTree(ms_01,(BYTE *)ms_00,(BYTE *)iend_00);
    }
    *(int *)((long)&in_RDI[1].nextSrc + 4) = iVar1 - (int)in_RDI->base;
  }
  return 0;
}

Assistant:

static size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t* ms,
                                         ldmState_t* ls,
                                         ZSTD_cwksp* ws,
                                         ZSTD_CCtx_params const* params,
                                         const void* src, size_t srcSize,
                                         ZSTD_dictTableLoadMethod_e dtlm,
                                         ZSTD_tableFillPurpose_e tfp)
{
    const BYTE* ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;
    int const loadLdmDict = params->ldmParams.enableLdm == ZSTD_ps_enable && ls != NULL;

    /* Assert that the ms params match the params we're being given */
    ZSTD_assertEqualCParams(params->cParams, ms->cParams);

    {   /* Ensure large dictionaries can't cause index overflow */

        /* Allow the dictionary to set indices up to exactly ZSTD_CURRENT_MAX.
         * Dictionaries right at the edge will immediately trigger overflow
         * correction, but I don't want to insert extra constraints here.
         */
        U32 maxDictSize = ZSTD_CURRENT_MAX - ZSTD_WINDOW_START_INDEX;

        int const CDictTaggedIndices = ZSTD_CDictIndicesAreTagged(&params->cParams);
        if (CDictTaggedIndices && tfp == ZSTD_tfp_forCDict) {
            /* Some dictionary matchfinders in zstd use "short cache",
             * which treats the lower ZSTD_SHORT_CACHE_TAG_BITS of each
             * CDict hashtable entry as a tag rather than as part of an index.
             * When short cache is used, we need to truncate the dictionary
             * so that its indices don't overlap with the tag. */
            U32 const shortCacheMaxDictSize = (1u << (32 - ZSTD_SHORT_CACHE_TAG_BITS)) - ZSTD_WINDOW_START_INDEX;
            maxDictSize = MIN(maxDictSize, shortCacheMaxDictSize);
            assert(!loadLdmDict);
        }

        /* If the dictionary is too large, only load the suffix of the dictionary. */
        if (srcSize > maxDictSize) {
            ip = iend - maxDictSize;
            src = ip;
            srcSize = maxDictSize;
        }
    }

    if (srcSize > ZSTD_CHUNKSIZE_MAX) {
        /* We must have cleared our windows when our source is this large. */
        assert(ZSTD_window_isEmpty(ms->window));
        if (loadLdmDict) assert(ZSTD_window_isEmpty(ls->window));
    }
    ZSTD_window_update(&ms->window, src, srcSize, /* forceNonContiguous */ 0);

    DEBUGLOG(4, "ZSTD_loadDictionaryContent(): useRowMatchFinder=%d", (int)params->useRowMatchFinder);

    if (loadLdmDict) { /* Load the entire dict into LDM matchfinders. */
        ZSTD_window_update(&ls->window, src, srcSize, /* forceNonContiguous */ 0);
        ls->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ls->window.base);
        ZSTD_ldm_fillHashTable(ls, ip, iend, &params->ldmParams);
    }

    /* If the dict is larger than we can reasonably index in our tables, only load the suffix. */
    if (params->cParams.strategy < ZSTD_btultra) {
        U32 maxDictSize = 8U << MIN(MAX(params->cParams.hashLog, params->cParams.chainLog), 28);
        if (srcSize > maxDictSize) {
            ip = iend - maxDictSize;
            src = ip;
            srcSize = maxDictSize;
        }
    }

    ms->nextToUpdate = (U32)(ip - ms->window.base);
    ms->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ms->window.base);
    ms->forceNonContiguous = params->deterministicRefPrefix;

    if (srcSize <= HASH_READ_SIZE) return 0;

    ZSTD_overflowCorrectIfNeeded(ms, ws, params, ip, iend);

    switch(params->cParams.strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, iend, dtlm, tfp);
        break;
    case ZSTD_dfast:
#ifndef ZSTD_EXCLUDE_DFAST_BLOCK_COMPRESSOR
        ZSTD_fillDoubleHashTable(ms, iend, dtlm, tfp);
#else
        assert(0); /* shouldn't be called: cparams should've been adjusted. */
#endif
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
#if !defined(ZSTD_EXCLUDE_GREEDY_BLOCK_COMPRESSOR) \
 || !defined(ZSTD_EXCLUDE_LAZY_BLOCK_COMPRESSOR) \
 || !defined(ZSTD_EXCLUDE_LAZY2_BLOCK_COMPRESSOR)
        assert(srcSize >= HASH_READ_SIZE);
        if (ms->dedicatedDictSearch) {
            assert(ms->chainTable != NULL);
            ZSTD_dedicatedDictSearch_lazy_loadDictionary(ms, iend-HASH_READ_SIZE);
        } else {
            assert(params->useRowMatchFinder != ZSTD_ps_auto);
            if (params->useRowMatchFinder == ZSTD_ps_enable) {
                size_t const tagTableSize = ((size_t)1 << params->cParams.hashLog);
                ZSTD_memset(ms->tagTable, 0, tagTableSize);
                ZSTD_row_update(ms, iend-HASH_READ_SIZE);
                DEBUGLOG(4, "Using row-based hash table for lazy dict");
            } else {
                ZSTD_insertAndFindFirstIndex(ms, iend-HASH_READ_SIZE);
                DEBUGLOG(4, "Using chain-based hash table for lazy dict");
            }
        }
#else
        assert(0); /* shouldn't be called: cparams should've been adjusted. */
#endif
        break;

    case ZSTD_btlazy2:   /* we want the dictionary table fully sorted */
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
#if !defined(ZSTD_EXCLUDE_BTLAZY2_BLOCK_COMPRESSOR) \
 || !defined(ZSTD_EXCLUDE_BTOPT_BLOCK_COMPRESSOR) \
 || !defined(ZSTD_EXCLUDE_BTULTRA_BLOCK_COMPRESSOR)
        assert(srcSize >= HASH_READ_SIZE);
        ZSTD_updateTree(ms, iend-HASH_READ_SIZE, iend);
#else
        assert(0); /* shouldn't be called: cparams should've been adjusted. */
#endif
        break;

    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    ms->nextToUpdate = (U32)(iend - ms->window.base);
    return 0;
}